

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O1

void __thiscall pfederc::Lexer::~Lexer(Lexer *this)

{
  pointer pcVar1;
  pointer puVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  
  this->_vptr_Lexer = (_func_int **)&PTR__Lexer_001285e0;
  pcVar1 = (this->lastComment)._M_dataplus._M_p;
  paVar3 = &(this->lastComment).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar3) {
    operator_delete(pcVar1,paVar3->_M_allocated_capacity + 1);
  }
  std::
  vector<std::unique_ptr<pfederc::Error<pfederc::LexerErrorCode>,_std::default_delete<pfederc::Error<pfederc::LexerErrorCode>_>_>,_std::allocator<std::unique_ptr<pfederc::Error<pfederc::LexerErrorCode>,_std::default_delete<pfederc::Error<pfederc::LexerErrorCode>_>_>_>_>
  ::~vector(&this->errors);
  puVar2 = (this->lineIndices).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (puVar2 != (pointer)0x0) {
    operator_delete(puVar2,(long)(this->lineIndices).
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar2);
  }
  std::
  vector<std::unique_ptr<pfederc::Token,_std::default_delete<pfederc::Token>_>,_std::allocator<std::unique_ptr<pfederc::Token,_std::default_delete<pfederc::Token>_>_>_>
  ::~vector(&this->tokens);
  pcVar1 = (this->fileContent)._M_dataplus._M_p;
  paVar3 = &(this->fileContent).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar3) {
    operator_delete(pcVar1,paVar3->_M_allocated_capacity + 1);
  }
  pcVar1 = (this->filePath)._M_dataplus._M_p;
  paVar3 = &(this->filePath).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar3) {
    operator_delete(pcVar1,paVar3->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

Lexer::~Lexer() {
}